

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm-sync-common.c
# Opt level: O2

void init_sync(Sync *sync)

{
  int iVar1;
  pthread_condattr_t condition_attributes;
  pthread_mutexattr_t mutex_attributes;
  
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&mutex_attributes);
  if (iVar1 != 0) {
    throw("Error initializing mutex attributes");
  }
  iVar1 = pthread_condattr_init((pthread_condattr_t *)&condition_attributes);
  if (iVar1 != 0) {
    throw("Error initializing condition variable attributes");
  }
  iVar1 = pthread_mutexattr_setpshared((pthread_mutexattr_t *)&mutex_attributes,1);
  if (iVar1 != 0) {
    throw("Error setting process-shared attribute for mutex");
  }
  iVar1 = pthread_condattr_setpshared((pthread_condattr_t *)&condition_attributes,1);
  if (iVar1 != 0) {
    throw("Error setting process-shared attribute for condition variable");
  }
  iVar1 = pthread_mutex_init((pthread_mutex_t *)sync,(pthread_mutexattr_t *)&mutex_attributes);
  if (iVar1 != 0) {
    throw("Error initializing mutex");
  }
  iVar1 = pthread_cond_init((pthread_cond_t *)&sync->condition,
                            (pthread_condattr_t *)&condition_attributes);
  if (iVar1 != 0) {
    throw("Error initializing condition variable");
  }
  iVar1 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&mutex_attributes);
  if (iVar1 != 0) {
    throw("Error destroying mutex attributes");
  }
  iVar1 = pthread_condattr_destroy((pthread_condattr_t *)&condition_attributes);
  if (iVar1 == 0) {
    return;
  }
  throw("Error destroying condition variable attributes");
}

Assistant:

void init_sync(struct Sync* sync) {
	// These structures are used to initialize mutexes
	// and condition variables. We will use them to set
	// the PTHREAD_PROCESS_SHARED attribute, which enables
	// more than one process (and any thread in any of those
	// processes) to access the mutex and condition variable.
	pthread_mutexattr_t mutex_attributes;
	pthread_condattr_t condition_attributes;

	// These methods initialize the attribute structures
	// with default values so that we must only change
	// the one we are interested in.
	if (pthread_mutexattr_init(&mutex_attributes) != 0) {
		throw("Error initializing mutex attributes");
	}
	if (pthread_condattr_init(&condition_attributes) != 0) {
		throw("Error initializing condition variable attributes");
	}

	// Here we set the "process-shared"-attribute of the mutex
	// and condition variable to PTHREAD_PROCESS_SHARED. This
	// means multiple processes may access these objects. If
	// we wouldn't do this, the attribute would be PTHREAD_PROCESS
	// _PRIVATE, where only threads created by the process who
	// initialized the objects would be allowed to access them.
	// By passing PTHREAD_PROCESS_SHARED the objects may also live
	// longer than the process creating them.
	// clang-format off
	if (pthread_mutexattr_setpshared(
				&mutex_attributes, PTHREAD_PROCESS_SHARED) != 0) {
		throw("Error setting process-shared attribute for mutex");
	}

	if (pthread_condattr_setpshared(
				&condition_attributes, PTHREAD_PROCESS_SHARED) != 0) {
		throw("Error setting process-shared attribute for condition variable");
	}
	// clang-format on

	// Initialize the mutex and condition variable and pass the attributes
	if (pthread_mutex_init(&sync->mutex, &mutex_attributes) != 0) {
		throw("Error initializing mutex");
	}
	if (pthread_cond_init(&sync->condition, &condition_attributes) != 0) {
		throw("Error initializing condition variable");
	}

	// Destroy the attribute objects
	if (pthread_mutexattr_destroy(&mutex_attributes)) {
		throw("Error destroying mutex attributes");
	}
	if (pthread_condattr_destroy(&condition_attributes)) {
		throw("Error destroying condition variable attributes");
	}
}